

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O1

QRect __thiscall QAccessibleLineEdit::characterRect(QAccessibleLineEdit *this,int offset)

{
  double dVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  QLineEdit *this_00;
  QWidget *this_01;
  QPoint QVar6;
  undefined8 extraout_RDX;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QMargins QVar11;
  QRect QVar12;
  QFontMetrics fm;
  QPoint local_60;
  int local_58;
  undefined4 uStack_54;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  lVar5 = QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject);
  local_58 = QTextLayout::lineAt((int)*(undefined8 *)(*(long *)(lVar5 + 8) + 600) + 0x118);
  local_40 = (undefined1 *)CONCAT44(local_40._4_4_,offset);
  puStack_50 = (undefined1 *)extraout_RDX;
  dVar1 = (double)QTextLine::cursorToX(&local_58,(Edge)&local_40);
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  this_00 = (QLineEdit *)QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject);
  QVar11 = QLineEdit::textMargins(this_00);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  lVar5 = QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject);
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_40,(QFont *)(*(long *)(lVar5 + 0x20) + 0x38));
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = -0x55555556;
  uStack_54 = 0xaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0xf8))(&local_58,this,offset,offset + 1);
  if (local_48 == (undefined1 *)0x0) {
    uVar8 = 0xffffffff;
    uVar10 = 0;
    uVar7 = 0xffffffff00000000;
    uVar9 = 0;
  }
  else {
    iVar3 = QFontMetrics::horizontalAdvance((QString *)&local_40,(int)&local_58);
    iVar4 = QFontMetrics::height();
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    this_01 = (QWidget *)QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject);
    local_60 = (QPoint)((ulong)(uint)(int)dVar1 | QVar11._0_8_ & 0xffffffff00000000);
    QVar6 = QWidget::mapToGlobal(this_01,&local_60);
    uVar8 = (ulong)((QVar6.xp.m_i.m_i + iVar3) - 1);
    uVar10 = (ulong)QVar6 & 0xffffffff00000000;
    uVar9 = (ulong)QVar6 & 0xffffffff;
    uVar7 = (ulong)((iVar4 + QVar6.yp.m_i.m_i) - 1) << 0x20;
  }
  piVar2 = (int *)CONCAT44(uStack_54,local_58);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),2,0x10);
    }
  }
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar12.x2.m_i = (int)(uVar7 | uVar8);
    QVar12.y2.m_i = (int)((uVar7 | uVar8) >> 0x20);
    QVar12.x1.m_i = (int)(uVar10 | uVar9);
    QVar12.y1.m_i = (int)((uVar10 | uVar9) >> 0x20);
    return QVar12;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAccessibleLineEdit::characterRect(int offset) const
{
    int x = lineEdit()->d_func()->control->cursorToX(offset);
    int y = lineEdit()->textMargins().top();
    QFontMetrics fm(lineEdit()->font());
    const QString ch = text(offset, offset + 1);
    if (ch.isEmpty())
        return QRect();
    int w = fm.horizontalAdvance(ch);
    int h = fm.height();
    QRect r(x, y, w, h);
    r.moveTo(lineEdit()->mapToGlobal(r.topLeft()));
    return r;
}